

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_rs_generator.cc
# Opt level: O0

string * __thiscall
t_rs_generator::rust_sync_service_call_invocation
          (string *__return_storage_ptr__,t_rs_generator *this,t_function *tfunc,
          string *field_prefix)

{
  bool bVar1;
  t_struct *tstruct;
  string local_1d0;
  undefined1 local_1a0 [8];
  ostringstream func_args;
  string *field_prefix_local;
  t_function *tfunc_local;
  t_rs_generator *this_local;
  
  func_args._368_8_ = field_prefix;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
  std::operator<<((ostream *)local_1a0,"(");
  bVar1 = has_args(this,tfunc);
  if (bVar1) {
    tstruct = t_function::get_arglist(tfunc);
    struct_to_invocation(&local_1d0,this,tstruct,(string *)func_args._368_8_);
    std::operator<<((ostream *)local_1a0,(string *)&local_1d0);
    std::__cxx11::string::~string((string *)&local_1d0);
  }
  std::operator<<((ostream *)local_1a0,")");
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
  return __return_storage_ptr__;
}

Assistant:

string t_rs_generator::rust_sync_service_call_invocation(t_function* tfunc, const string& field_prefix) {
  ostringstream func_args;
  func_args << "(";

  if (has_args(tfunc)) {
    func_args << struct_to_invocation(tfunc->get_arglist(), field_prefix);
  }

  func_args << ")";
  return func_args.str();
}